

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void show_temp_history(CHAR_DATA *ch,CHAR_DATA *victim)

{
  BUFFER *buffer;
  char *pcVar1;
  
  buffer = new_buf();
  send_to_char(victim->name,ch);
  send_to_char("\'s temporary history buffer:\n\r",ch);
  pcVar1 = victim->pcdata->temp_history_buffer;
  if ((pcVar1 != (char *)0x0) && (*pcVar1 != '\0')) {
    add_buf(buffer,pcVar1);
    pcVar1 = buf_string(buffer);
    page_to_char(pcVar1,ch);
    free_buf(buffer);
    return;
  }
  send_to_char("Temporary buffer is clear.\n\r",ch);
  return;
}

Assistant:

void show_temp_history(CHAR_DATA *ch, CHAR_DATA *victim)
{
	BUFFER *output;

	output = new_buf();
	send_to_char(victim->name, ch);
	send_to_char("'s temporary history buffer:\n\r", ch);

	if (victim->pcdata->temp_history_buffer == nullptr || victim->pcdata->temp_history_buffer[0] == '\0')
	{
		send_to_char("Temporary buffer is clear.\n\r", ch);
	}
	else
	{
		add_buf(output, victim->pcdata->temp_history_buffer);
		page_to_char(buf_string(output), ch);
		free_buf(output);
	}
}